

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::seedRng(IConfig *config)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  
  iVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])();
  if (iVar1 != 0) {
    uVar2 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
    srand(uVar2);
    rng();
    uVar2 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
    uVar3 = (ulong)uVar2;
    lVar4 = 1;
    rng::s_rng._M_x[0] = uVar3;
    do {
      uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
      rng::s_rng._M_x[lVar4] = uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    rng::s_rng._M_p = 0x270;
  }
  return;
}

Assistant:

void seedRng( IConfig const& config ) {
        if( config.rngSeed() != 0 ) {
            std::srand( config.rngSeed() );
            rng().seed( config.rngSeed() );
        }
    }